

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

uint32 Js::JavascriptArray::GetSpreadArgLen(Var spreadArg,ScriptContext *scriptContext)

{
  List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  Var aValue;
  TypedArrayBase *pTVar5;
  SpreadArgument *pSVar6;
  undefined4 *puVar7;
  
  aValue = CrossSite::MarshalVar(scriptContext,spreadArg,false);
  pTVar5 = (TypedArrayBase *)TryVarToNonES5Array(aValue);
  if (pTVar5 == (TypedArrayBase *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase>(aValue);
    if (bVar3) {
      pTVar5 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
      if (pTVar5 != (TypedArrayBase *)0x0) goto LAB_00a53a1a;
    }
    bVar3 = VarIs<Js::SpreadArgument>(aValue);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2e2f,"(false)",
                                  "LdCustomSpreadIteratorList should have converted the arg to one of the above types"
                                 );
      if (bVar3) {
        *puVar7 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    pSVar6 = VarTo<Js::SpreadArgument>(aValue);
    pLVar1 = (pSVar6->iteratorIndices).ptr;
    if (pLVar1 == (List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
                  0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).count;
    }
  }
  else {
LAB_00a53a1a:
    uVar4 = (pTVar5->super_ArrayBufferParent).super_ArrayObject.length;
  }
  return uVar4;
}

Assistant:

uint32 JavascriptArray::GetSpreadArgLen(Var spreadArg, ScriptContext *scriptContext)
    {
        // A spread argument can be anything that returns a 'length' property, even if that
        // property is null or undefined.
        spreadArg = CrossSite::MarshalVar(scriptContext, spreadArg);
        JavascriptArray *arr = JavascriptArray::TryVarToNonES5Array(spreadArg);
        if (arr)
        {
            return arr->GetLength();
        }

        TypedArrayBase *tarr = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(spreadArg);
        if (tarr)
        {
            return tarr->GetLength();
        }

        if (VarIs<SpreadArgument>(spreadArg))
        {
            SpreadArgument *spreadFunctionArgs = VarTo<SpreadArgument>(spreadArg);
            return spreadFunctionArgs->GetArgumentSpreadCount();
        }

        AssertMsg(false, "LdCustomSpreadIteratorList should have converted the arg to one of the above types");
        Throw::FatalInternalError();
    }